

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_maskg(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGv_i64 ret;
  uint32_t uVar1;
  TCGLabel *l;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 ret_02;
  TCGv_i64 ret_03;
  TCGv_i64 t3;
  TCGv_i64 t2;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGLabel *l1;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  s = ctx->uc->tcg_ctx;
  l = gen_new_label_ppc64(s);
  ret_00 = tcg_temp_new_i64(s);
  ret_01 = tcg_temp_new_i64(s);
  ret_02 = tcg_temp_new_i64(s);
  ret_03 = tcg_temp_new_i64(s);
  tcg_gen_movi_i64_ppc64(s,ret_03,0xffffffff);
  uVar1 = rB(ctx->opcode);
  tcg_gen_andi_i64_ppc64(s,ret_00,cpu_gpr[uVar1],0x1f);
  uVar1 = rS(ctx->opcode);
  tcg_gen_andi_i64_ppc64(s,ret_01,cpu_gpr[uVar1],0x1f);
  tcg_gen_addi_i64_ppc64(s,ret_02,ret_00,1);
  tcg_gen_shr_i64_ppc64(s,ret_02,ret_03,ret_02);
  tcg_gen_shr_i64_ppc64(s,ret_03,ret_03,ret_01);
  uVar1 = rA(ctx->opcode);
  tcg_gen_xor_i64_ppc64(s,cpu_gpr[uVar1],ret_02,ret_03);
  tcg_gen_brcond_i64_ppc64(s,TCG_COND_GE,ret_00,ret_01,l);
  uVar1 = rA(ctx->opcode);
  ret = cpu_gpr[uVar1];
  uVar1 = rA(ctx->opcode);
  tcg_gen_neg_i64(s,ret,cpu_gpr[uVar1]);
  gen_set_label(s,l);
  tcg_temp_free_i64(s,ret_00);
  tcg_temp_free_i64(s,ret_01);
  tcg_temp_free_i64(s,ret_02);
  tcg_temp_free_i64(s,ret_03);
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    uVar1 = rA(ctx->opcode);
    gen_set_Rc0(ctx,cpu_gpr[uVar1]);
  }
  return;
}

Assistant:

static void gen_maskg(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    TCGv t2 = tcg_temp_new(tcg_ctx);
    TCGv t3 = tcg_temp_new(tcg_ctx);
    tcg_gen_movi_tl(tcg_ctx, t3, 0xFFFFFFFF);
    tcg_gen_andi_tl(tcg_ctx, t0, cpu_gpr[rB(ctx->opcode)], 0x1F);
    tcg_gen_andi_tl(tcg_ctx, t1, cpu_gpr[rS(ctx->opcode)], 0x1F);
    tcg_gen_addi_tl(tcg_ctx, t2, t0, 1);
    tcg_gen_shr_tl(tcg_ctx, t2, t3, t2);
    tcg_gen_shr_tl(tcg_ctx, t3, t3, t1);
    tcg_gen_xor_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t2, t3);
    tcg_gen_brcond_tl(tcg_ctx, TCG_COND_GE, t0, t1, l1);
    tcg_gen_neg_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rA(ctx->opcode)]);
    gen_set_label(tcg_ctx, l1);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t2);
    tcg_temp_free(tcg_ctx, t3);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}